

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_async_notification_signal(ma_async_notification *pNotification)

{
  long *in_RDI;
  ma_async_notification_callbacks *pNotificationCallbacks;
  undefined4 local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*in_RDI == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    (*(code *)*in_RDI)(in_RDI);
    local_4 = MA_INVALID_ARGS;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_async_notification_signal(ma_async_notification* pNotification)
{
    ma_async_notification_callbacks* pNotificationCallbacks = (ma_async_notification_callbacks*)pNotification;

    if (pNotification == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pNotificationCallbacks->onSignal == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    pNotificationCallbacks->onSignal(pNotification);
    return MA_INVALID_ARGS;
}